

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O1

void __thiscall
SPTest_ConstantExprInExpectation_Test::~SPTest_ConstantExprInExpectation_Test
          (SPTest_ConstantExprInExpectation_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SPTest, ConstantExprInExpectation) {
  TestBasicProblem p(1);
  p.AddExpectationObj(
        p.MakeBinary(expr::MUL, p.MakeNumericConstant(6),
                     p.MakeNumericConstant(7)));
  mp::SPAdapter sp(p);
  auto constant = mp::Cast<mp::NumericConstant>(sp.obj(0).nonlinear_expr());
  EXPECT_EQ(42, constant.value());
}